

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_bit_P(envy_bios *bios,FILE *out,uint mask)

{
  int iVar1;
  uint local_3c;
  int i;
  int ret;
  uint32_t addr;
  char *name;
  envy_bios_power *power;
  FILE *pFStack_18;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  name = (char *)&bios->power;
  if ((((envy_bios_power *)name)->bit != (envy_bios_bit_entry *)0x0) && ((mask & 0x400) != 0)) {
    power._4_4_ = mask;
    pFStack_18 = (FILE *)out;
    out_local = (FILE *)bios;
    fprintf((FILE *)out,"BIT table \'P\' at 0x%x, version %i\n",
            (ulong)((envy_bios_power *)name)->bit->offset,
            (ulong)((envy_bios_power *)name)->bit->version);
    for (local_3c = 0; (int)local_3c < (int)(uint)*(ushort *)(*(long *)name + 6);
        local_3c = local_3c + 4) {
      iVar1 = bios_u32((envy_bios *)out_local,*(ushort *)(*(long *)name + 4) + local_3c,
                       (uint32_t *)&i);
      if ((iVar1 == 0) && (i != 0)) {
        _ret = "UNKNOWN";
        parse_at((envy_bios *)out_local,(envy_bios_power *)name,-1,local_3c,(char **)&ret);
        fprintf(pFStack_18,"0x%02x: 0x%x => %s TABLE\n",(ulong)local_3c,(ulong)(uint)i,_ret);
      }
    }
    fprintf(pFStack_18,"\n");
  }
  return;
}

Assistant:

void envy_bios_print_bit_P (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power *power = &bios->power;
	const char *name;
	uint32_t addr;
	int ret = 0, i = 0;
	
	if (!power->bit || !(mask & ENVY_BIOS_PRINT_PERF))
		return;

	fprintf(out, "BIT table 'P' at 0x%x, version %i\n", 
		power->bit->offset, power->bit->version);

	for (i = 0; i < power->bit->t_len; i+=4) {
		ret = bios_u32(bios, power->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, power, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}
	
	fprintf(out, "\n");
}